

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_get_(void *origin_addr,MPIABI_Fint *origin_count,MPIABI_Fint *origin_datatype,
                MPIABI_Fint *target_rank,MPIABI_Fint *target_disp,MPIABI_Fint *target_count,
                MPIABI_Fint *target_datatype,MPIABI_Fint *win,MPIABI_Fint *ierror)

{
  mpi_get_();
  return;
}

Assistant:

void mpiabi_get_(
  void * origin_addr,
  const MPIABI_Fint * origin_count,
  const MPIABI_Fint * origin_datatype,
  const MPIABI_Fint * target_rank,
  const MPIABI_Fint * target_disp,
  const MPIABI_Fint * target_count,
  const MPIABI_Fint * target_datatype,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_get_(
    origin_addr,
    origin_count,
    origin_datatype,
    target_rank,
    target_disp,
    target_count,
    target_datatype,
    win,
    ierror
  );
}